

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O1

uint32_t farmhash32_cc(char *s,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  
  uVar3 = (uint)len;
  if (0x18 < len) {
    uVar1 = (*(int *)(s + (len - 4)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 4)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^ uVar3;
    uVar1 = (uVar1 >> 0x13 | uVar1 << 0xd) * 5 + 0xe6546b64 ^
            (*(int *)(s + (len - 0x10)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 0x10)) * -0x3361d2af) >> 0x11) * 0x1b873593;
    uVar2 = (uVar1 >> 0x13 | uVar1 << 0xd) * 5 + 0xe6546b64;
    uVar1 = (*(int *)(s + (len - 8)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 8)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            uVar3 * -0x3361d2af;
    uVar1 = (uVar1 >> 0x13 | uVar1 << 0xd) * 5 + 0xe6546b64 ^
            (*(int *)(s + (len - 0xc)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 0xc)) * -0x3361d2af) >> 0x11) * 0x1b873593;
    uVar1 = (uVar1 >> 0x13 | uVar1 << 0xd) * 5 + 0xe6546b64;
    uVar3 = (*(int *)(s + (len - 0x14)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 0x14)) * -0x3361d2af) >> 0x11) * 0x1b873593 +
            uVar3 * -0x3361d2af;
    uVar3 = (uVar3 >> 0x13 | uVar3 * 0x2000) * 5 + 0xe6546b64;
    uVar4 = (len - 1) / 0x14;
    do {
      uVar6 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593;
      uVar1 = (*(int *)((long)s + 8) * 0x16a88000 |
              (uint)(*(int *)((long)s + 8) * -0x3361d2af) >> 0x11) * 0x1b873593 + uVar1;
      uVar2 = uVar2 ^ uVar6;
      uVar9 = uVar3 + *(int *)((long)s + 4);
      uVar3 = (*(int *)((long)s + 0xc) * 0x16a88000 |
              (uint)(*(int *)((long)s + 0xc) * -0x3361d2af) >> 0x11) * 0x1b873593 +
              *(int *)((long)s + 4) ^ (uVar2 >> 0x12 | uVar2 << 0xe) * 5 + 0xe6546b64;
      uVar2 = (uVar1 >> 0x12 | uVar1 * 0x4000) * 5 + 0xe6546b64 ^ *(uint *)((long)s + 0x10);
      uVar1 = 0x18;
      uVar12 = 0x18;
      lVar13 = 0;
      uVar7 = uVar2;
      do {
        uVar10 = 0xff << (uVar1 & 0x1f);
        uVar11 = 0xff << ((uint)lVar13 & 0x1f);
        uVar7 = ~(uVar10 | uVar11) & uVar7 |
                (uVar10 & uVar2) >> (uVar12 & 0x1f) | (uVar11 & uVar2) << (uVar12 & 0x1f);
        lVar13 = lVar13 + 8;
        uVar12 = uVar12 - 0x10;
        uVar1 = uVar1 - 8;
      } while (lVar13 == 8);
      uVar3 = ((uVar3 >> 0x13 | uVar3 << 0xd) + *(uint *)((long)s + 0x10)) * 5 + 0xe6546b64;
      uVar2 = 0x18;
      uVar12 = 0x18;
      lVar13 = 0;
      uVar1 = uVar3;
      do {
        uVar10 = 0xff << (uVar2 & 0x1f);
        uVar11 = 0xff << ((uint)lVar13 & 0x1f);
        uVar1 = ~(uVar10 | uVar11) & uVar1 |
                (uVar10 & uVar3) >> (uVar12 & 0x1f) | (uVar11 & uVar3) << (uVar12 & 0x1f);
        lVar13 = lVar13 + 8;
        uVar12 = uVar12 - 0x10;
        uVar2 = uVar2 - 8;
      } while (lVar13 == 8);
      uVar3 = uVar7 * 5;
      uVar2 = (uVar9 >> 0x13 | uVar9 * 0x2000) * -0x3361d2af + uVar6;
      s = (char *)((long)s + 0x14);
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    uVar2 = ((uVar1 >> 0xb) * 0x16a88000 | (uVar1 >> 0xb | uVar1 << 0x15) * -0x3361d2af >> 0x11) *
            -0x3361d2af + uVar2;
    uVar1 = (uVar2 >> 0x13 | uVar2 * 0x2000) * 5 + 0xe6546b64;
    iVar8 = (uVar1 >> 0x11 | uVar1 * 0x8000) +
            ((uVar3 >> 0xb) * 0x16a88000 | (uVar7 * 0xa00000 | uVar3 >> 0xb) * -0x3361d2af >> 0x11);
    uVar3 = (iVar8 * -0x3a55e000 | (uint)(iVar8 * -0x3361d2af) >> 0x13) * 5 + 0xe6546b64;
    return (uVar3 >> 0x11 | uVar3 * 0x8000) * -0x3361d2af;
  }
  if (len < 0xd) {
    if (len < 5) {
      if (len == 0) {
        uVar1 = 0;
        uVar2 = 9;
      }
      else {
        uVar2 = 9;
        uVar1 = 0;
        sVar5 = 0;
        do {
          uVar1 = uVar1 * -0x3361d2af + (int)s[sVar5];
          uVar2 = uVar2 ^ uVar1;
          sVar5 = sVar5 + 1;
        } while (len != sVar5);
      }
      uVar2 = (uVar3 * 0x16a88000 | uVar3 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar2;
      uVar3 = uVar2 >> 0x13 | uVar2 << 0xd;
    }
    else {
      iVar8 = *(int *)(s + (len - 4)) + uVar3 * 5;
      uVar1 = *(int *)(s + (ulong)(uVar3 >> 3 & 1) * 4) + 9;
      uVar3 = ((*(int *)s + uVar3) * 0x16a88000 | (*(int *)s + uVar3) * -0x3361d2af >> 0x11) *
              0x1b873593 ^ uVar3 * 5;
      uVar3 = (iVar8 * 0x16a88000 | (uint)(iVar8 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
      uVar3 = uVar3 >> 0x13 | uVar3 << 0xd;
    }
    uVar3 = (uVar1 * 0x16a88000 | uVar1 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar3 * 5 + 0xe6546b64
    ;
    uVar3 = uVar3 >> 0x13 | uVar3 << 0xd;
  }
  else {
    uVar3 = (*(int *)(s + ((len >> 1) - 4)) * 0x16a88000 |
            (uint)(*(int *)(s + ((len >> 1) - 4)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^ uVar3;
    uVar3 = (*(int *)(s + 4) * 0x16a88000 | (uint)(*(int *)(s + 4) * -0x3361d2af) >> 0x11) *
            0x1b873593 ^ (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
    uVar3 = (*(int *)(s + (len - 8)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 8)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
    uVar3 = (*(int *)(s + (len >> 1)) * 0x16a88000 |
            (uint)(*(int *)(s + (len >> 1)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
    uVar3 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
    uVar3 = (*(int *)(s + (len - 4)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 4)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
    uVar3 = uVar3 >> 0x13 | uVar3 << 0xd;
  }
  uVar3 = uVar3 * 5 + 0xe6546b64;
  uVar3 = (uVar3 >> 0x10 ^ uVar3) * -0x7a143595;
  uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
  return uVar3 >> 0x10 ^ uVar3;
}

Assistant:

uint32_t farmhash32_cc(const char *s, size_t len) {
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ? farmhash32_cc_len_0_to_4(s, len) : farmhash32_cc_len_5_to_12(s, len)) :
        farmhash32_cc_len_13_to_24(s, len);
  }

  // len > 24
  uint32_t h = len, g = c1 * len, f = g;
  uint32_t a0 = ror32(fetch32(s + len - 4) * c1, 17) * c2;
  uint32_t a1 = ror32(fetch32(s + len - 8) * c1, 17) * c2;
  uint32_t a2 = ror32(fetch32(s + len - 16) * c1, 17) * c2;
  uint32_t a3 = ror32(fetch32(s + len - 12) * c1, 17) * c2;
  uint32_t a4 = ror32(fetch32(s + len - 20) * c1, 17) * c2;
  h ^= a0;
  h = ror32(h, 19);
  h = h * 5 + 0xe6546b64;
  h ^= a2;
  h = ror32(h, 19);
  h = h * 5 + 0xe6546b64;
  g ^= a1;
  g = ror32(g, 19);
  g = g * 5 + 0xe6546b64;
  g ^= a3;
  g = ror32(g, 19);
  g = g * 5 + 0xe6546b64;
  f += a4;
  f = ror32(f, 19);
  f = f * 5 + 0xe6546b64;
  size_t iters = (len - 1) / 20;
  do {
    uint32_t a0 = ror32(fetch32(s) * c1, 17) * c2;
    uint32_t a1 = fetch32(s + 4);
    uint32_t a2 = ror32(fetch32(s + 8) * c1, 17) * c2;
    uint32_t a3 = ror32(fetch32(s + 12) * c1, 17) * c2;
    uint32_t a4 = fetch32(s + 16);
    h ^= a0;
    h = ror32(h, 18);
    h = h * 5 + 0xe6546b64;
    f += a1;
    f = ror32(f, 19);
    f = f * c1;
    g += a2;
    g = ror32(g, 18);
    g = g * 5 + 0xe6546b64;
    h ^= a3 + a1;
    h = ror32(h, 19);
    h = h * 5 + 0xe6546b64;
    g ^= a4;
    g = bswap32(g) * 5;
    h += a4 * 5;
    h = bswap32(h);
    f += a0;
    PERMUTE3(&f, &h, &g);
    s += 20;
  } while (--iters != 0);
  g = ror32(g, 11) * c1;
  g = ror32(g, 17) * c1;
  f = ror32(f, 11) * c1;
  f = ror32(f, 17) * c1;
  h = ror32(h + g, 19);
  h = h * 5 + 0xe6546b64;
  h = ror32(h, 17) * c1;
  h = ror32(h + f, 19);
  h = h * 5 + 0xe6546b64;
  h = ror32(h, 17) * c1;
  return h;
}